

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ROIAlign_x86_avx::forward
          (ROIAlign_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pMVar4;
  Mat *this_00;
  _func_int **pp_Var5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  void *pvVar9;
  _func_int *p_Var10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [12];
  undefined1 in_ZMM5 [64];
  undefined1 auVar38 [16];
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  allocator_type local_111;
  void *local_110;
  void *local_108;
  long local_100;
  void *local_f8;
  _func_int **local_f0;
  void *local_e8;
  long local_e0;
  ulong local_d8;
  _func_int **local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ROIAlign_x86_avx *local_90;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  undefined1 auVar39 [64];
  
  auVar37 = in_ZMM5._4_12_;
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar16 = pMVar4->w;
  iVar12 = pMVar4->h;
  local_e8 = (void *)(ulong)(uint)pMVar4->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx[-3]),pMVar4->c,
              pMVar4->elemsize,opt->blob_allocator);
  iVar11 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var5 = this->_vptr_ROIAlign_x86_avx;
    p_Var10 = pp_Var5[-3];
    fVar33 = *(float *)(&this->field_0xd8 + (long)p_Var10);
    uVar2 = *pMVar4[1].data;
    uVar3 = *(undefined8 *)((long)pMVar4[1].data + 8);
    local_b8._0_4_ = fVar33 * (float)uVar2;
    local_b8._4_4_ = fVar33 * (float)((ulong)uVar2 >> 0x20);
    local_b8._8_4_ = fVar33 * 0.0;
    local_b8._12_4_ = fVar33 * 0.0;
    auVar25._0_4_ = (float)uVar3 * fVar33;
    auVar25._4_4_ = (float)((ulong)uVar3 >> 0x20) * fVar33;
    auVar25._8_4_ = fVar33 * 0.0;
    auVar25._12_4_ = fVar33 * 0.0;
    bVar24 = (&this->field_0xe0)[(long)p_Var10] != '\0';
    if (bVar24) {
      local_b8._0_4_ = (float)local_b8._0_4_ + -0.5;
      local_b8._4_4_ = local_b8._4_4_ + -0.5;
      local_b8._8_4_ = local_b8._8_4_ + -0.5;
      local_b8._12_4_ = local_b8._12_4_ + -0.5;
      auVar25._0_4_ = auVar25._0_4_ + -0.5;
      auVar25._4_4_ = auVar25._4_4_ + -0.5;
      auVar25._8_4_ = auVar25._8_4_ + -0.5;
      auVar25._12_4_ = auVar25._12_4_ + -0.5;
    }
    auVar25 = vsubps_avx(auVar25,local_b8);
    if (!bVar24) {
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar25 = vmaxps_avx(auVar25,auVar31);
    }
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)(&this->field_0xd0 + (long)p_Var10);
    auVar31 = vcvtdq2ps_avx(auVar27);
    auVar27 = vrcpps_avx(auVar31);
    fVar33 = auVar25._0_4_ * auVar27._0_4_;
    fVar34 = auVar25._4_4_ * auVar27._4_4_;
    fVar35 = auVar25._8_4_ * auVar27._8_4_;
    fVar36 = auVar25._12_4_ * auVar27._12_4_;
    auVar28._0_4_ = auVar31._0_4_ * fVar33;
    auVar28._4_4_ = auVar31._4_4_ * fVar34;
    auVar28._8_4_ = auVar31._8_4_ * fVar35;
    auVar28._12_4_ = auVar31._12_4_ * fVar36;
    auVar25 = vsubps_avx(auVar25,auVar28);
    local_c8._0_4_ = fVar33 + auVar27._0_4_ * auVar25._0_4_;
    local_c8._4_4_ = fVar34 + auVar27._4_4_ * auVar25._4_4_;
    local_c8._8_4_ = fVar35 + auVar27._8_4_ * auVar25._8_4_;
    local_c8._12_4_ = fVar36 + auVar27._12_4_ * auVar25._12_4_;
    local_90 = this;
    if (*(int *)(&this->field_0xe4 + (long)p_Var10) == 1) {
      local_108 = (void *)CONCAT44(local_108._4_4_,iVar16);
      iVar16 = *(int *)(&this->field_0xdc + (long)p_Var10);
      fVar34 = (float)iVar16;
      local_a8 = vmovshdup_avx(local_c8);
      fVar33 = fVar34;
      if (iVar16 < 1) {
        auVar25 = vroundss_avx(local_a8,local_a8,10);
        fVar33 = auVar25._0_4_;
      }
      local_f0 = (_func_int **)CONCAT44(local_f0._4_4_,iVar12);
      iVar12 = (int)fVar33;
      if (iVar16 < 1) {
        auVar25 = vroundss_avx(local_c8,local_c8,10);
        fVar34 = auVar25._0_4_;
      }
      iVar16 = (int)fVar34;
      local_100 = (long)iVar12;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)*(int *)(&this->field_0xd4 + (long)pp_Var5[-3]) *
                 (long)*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) * local_100 * iVar16,
                 &local_111);
      auVar25 = vmovshdup_avx(local_b8);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)local_f0,(int)local_108,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx[-3]),(int)local_100
                 ,iVar16,auVar25._0_4_,local_b8._0_4_,(float)local_a8._0_4_,(float)local_c8._0_4_,
                 (int)local_100,iVar16,&pre_calc);
      if (0 < (int)local_e8) {
        iVar11 = 1;
        if (1 < iVar12 * iVar16) {
          iVar11 = iVar12 * iVar16;
        }
        local_d0 = (_func_int **)pMVar4->data;
        local_d8 = pMVar4->cstep * pMVar4->elemsize;
        local_f8 = this_00->data;
        local_e0 = this_00->cstep * this_00->elemsize;
        local_f0 = this->_vptr_ROIAlign_x86_avx;
        local_110 = (void *)0x0;
        iVar21 = 0;
        if (0 < iVar16) {
          iVar21 = iVar16;
        }
        local_a8._0_4_ = iVar21 * iVar12;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)local_f0[-3])) {
            lVar20 = local_d8 * (long)local_110;
            local_108 = (void *)(local_e0 * (long)local_110 + (long)local_f8);
            iVar19 = 0;
            iVar23 = 0;
            do {
              local_100 = CONCAT44(local_100._4_4_,iVar19);
              iVar17 = *(int *)(&this->field_0xd0 + (long)local_f0[-3]);
              if (0 < iVar17) {
                lVar14 = 0;
                do {
                  if (iVar12 < 1) {
                    fVar33 = 0.0;
                  }
                  else {
                    fVar33 = 0.0;
                    iVar18 = 0;
                    iVar17 = iVar23;
                    do {
                      if (0 < iVar16) {
                        pfVar15 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar17].w1;
                        iVar22 = iVar16;
                        do {
                          auVar25 = vinsertps_avx(ZEXT416(*(uint *)((long)local_d0 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar15 + -4))->pos1 * 4 +
                                                                   lVar20)),
                                                  ZEXT416(*(uint *)((long)local_d0 +
                                                                   (long)(int)pfVar15[-3] * 4 +
                                                                   lVar20)),0x10);
                          auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)((long)local_d0 +
                                                                           (long)(int)pfVar15[-2] *
                                                                           4 + lVar20)),0x20);
                          auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)((long)local_d0 +
                                                                           (long)(int)pfVar15[-1] *
                                                                           4 + lVar20)),0x30);
                          auVar32._0_4_ = auVar25._0_4_ * *pfVar15;
                          auVar32._4_4_ = auVar25._4_4_ * pfVar15[1];
                          auVar32._8_4_ = auVar25._8_4_ * pfVar15[2];
                          auVar32._12_4_ = auVar25._12_4_ * pfVar15[3];
                          auVar25 = vhaddps_avx(auVar32,auVar32);
                          auVar25 = vhaddps_avx(auVar25,auVar25);
                          fVar33 = fVar33 + auVar25._0_4_;
                          pfVar15 = pfVar15 + 8;
                          iVar22 = iVar22 + -1;
                        } while (iVar22 != 0);
                      }
                      iVar18 = iVar18 + 1;
                      iVar17 = iVar17 + iVar21;
                    } while (iVar18 != iVar12);
                    iVar23 = iVar23 + iVar21 * iVar12;
                    this = local_90;
                  }
                  *(float *)((long)local_108 + lVar14 * 4) = fVar33 * (1.0 / (float)iVar11);
                  lVar14 = lVar14 + 1;
                  iVar17 = *(int *)(&this->field_0xd0 + (long)local_f0[-3]);
                } while (lVar14 < iVar17);
              }
              local_108 = (void *)((long)local_108 + (long)iVar17 * 4);
              iVar19 = iVar19 + 1;
            } while (iVar19 < *(int *)(&this->field_0xd4 + (long)local_f0[-3]));
          }
          local_110 = (void *)((long)local_110 + 1);
        } while (local_110 != local_e8);
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var10) != 0) {
        return 0;
      }
      auVar27 = vroundps_avx(local_c8,10);
      auVar30._8_8_ = 0x4330000000000000;
      auVar30._0_8_ = 0x4330000000000000;
      auVar25 = vorpd_avx(ZEXT416(*(uint *)(&this->field_0xdc + (long)p_Var10)),auVar30);
      auVar25 = vsubpd_avx(auVar25,auVar30);
      auVar25 = vcvtpd2ps_avx(auVar25);
      auVar25 = vmovsldup_avx(auVar25);
      auVar31 = vpshufd_avx(ZEXT116(0 < *(int *)(&this->field_0xdc + (long)p_Var10)),0x50);
      auVar31 = vpslld_avx(auVar31,0x1f);
      auVar25 = vblendvps_avx(auVar27,auVar25,auVar31);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)*(int *)(&this->field_0xd4 + (long)pp_Var5[-3]) * (long)(int)auVar25._4_4_ *
                 (long)*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) * (long)(int)auVar25._0_4_,
                 &local_111);
      p_Var10 = this->_vptr_ROIAlign_x86_avx[-3];
      auVar25 = vmovshdup_avx(local_c8);
      auVar31 = vmovshdup_avx(local_b8);
      fVar33 = auVar31._0_4_;
      fVar34 = auVar25._0_4_;
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar12,iVar16,*(int *)(&this->field_0xd4 + (long)p_Var10),
                 *(int *)(&this->field_0xd0 + (long)p_Var10),fVar33,(float)local_b8._0_4_,fVar34,
                 local_c8._0_4_,*(int *)(&this->field_0xdc + (long)p_Var10),&pre_calc);
      if (0 < (int)local_e8) {
        local_e0 = pMVar4->cstep * pMVar4->elemsize;
        sVar6 = this_00->cstep;
        sVar7 = this_00->elemsize;
        auVar26._0_4_ = (float)iVar12;
        auVar26._4_12_ = auVar37;
        pvVar8 = pMVar4->data;
        auVar29._0_4_ = (float)iVar16;
        auVar29._4_12_ = auVar37;
        pvVar9 = this_00->data;
        local_d0 = this->_vptr_ROIAlign_x86_avx;
        local_f8 = (void *)0x0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)local_d0[-3])) {
            lVar20 = local_e0 * (long)local_f8;
            local_110 = (void *)(sVar6 * sVar7 * (long)local_f8 + (long)pvVar9);
            uVar13 = 0;
            iVar16 = 0;
            do {
              p_Var10 = local_d0[-3];
              iVar12 = *(int *)(&this->field_0xd0 + (long)p_Var10);
              iVar11 = (int)uVar13;
              if (0 < iVar12) {
                auVar25 = vmaxss_avx(ZEXT416((uint)(fVar33 + fVar34 * (float)iVar11)),
                                     ZEXT816(0) << 0x40);
                auVar31 = vminss_avx(auVar26,auVar25);
                auVar25 = vmaxss_avx(ZEXT416((uint)(fVar33 + fVar34 * (float)(iVar11 + 1))),
                                     ZEXT816(0) << 0x40);
                auVar25 = vminss_avx(auVar26,auVar25);
                fVar35 = auVar31._0_4_;
                fVar36 = auVar25._0_4_;
                auVar25 = vroundss_avx(ZEXT416((uint)(fVar36 - fVar35)),
                                       ZEXT416((uint)(fVar36 - fVar35)),10);
                lVar14 = 0;
                do {
                  iVar12 = *(int *)(&this->field_0xdc + (long)p_Var10);
                  fVar40 = (float)iVar12;
                  lVar1 = lVar14 + 1;
                  fVar42 = fVar40;
                  if (iVar12 < 1) {
                    fVar42 = auVar25._0_4_;
                  }
                  auVar38._0_12_ = ZEXT812(0);
                  auVar38._12_4_ = 0;
                  auVar39 = ZEXT1664(auVar38);
                  auVar31 = vmaxss_avx(ZEXT416((uint)((float)local_b8._0_4_ +
                                                     (float)local_c8._0_4_ * (float)(int)lVar14)),
                                       auVar38);
                  auVar27 = vminss_avx(auVar31,auVar29);
                  auVar31 = vmaxss_avx(ZEXT416((uint)((float)local_b8._0_4_ +
                                                     (float)local_c8._0_4_ * (float)(int)lVar1)),
                                       auVar38);
                  auVar31 = vminss_avx(auVar31,auVar29);
                  fVar43 = auVar27._0_4_;
                  fVar44 = auVar31._0_4_;
                  if (iVar12 < 1) {
                    auVar31 = vroundss_avx(ZEXT416((uint)(fVar44 - fVar43)),
                                           ZEXT416((uint)(fVar44 - fVar43)),10);
                    fVar40 = auVar31._0_4_;
                  }
                  iVar12 = (int)fVar42;
                  iVar21 = (int)fVar40;
                  if (0 < iVar12) {
                    local_100 = CONCAT71(local_100._1_7_,fVar44 <= fVar43);
                    local_f0 = (_func_int **)CONCAT71(local_f0._1_7_,fVar36 <= fVar35);
                    local_a8._0_8_ = lVar1;
                    iVar23 = 0;
                    iVar19 = 0;
                    if (0 < iVar21) {
                      iVar19 = iVar21;
                    }
                    local_108 = (void *)CONCAT44(local_108._4_4_,iVar16);
                    iVar17 = iVar16;
                    do {
                      if (0 < iVar21) {
                        pfVar15 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar17].w1;
                        iVar18 = iVar21;
                        do {
                          auVar31 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar8 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar15 + -4))->pos1 * 4 +
                                                                   lVar20)),
                                                  ZEXT416(*(uint *)((long)pvVar8 +
                                                                   (long)(int)pfVar15[-3] * 4 +
                                                                   lVar20)),0x10);
                          auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)((long)pvVar8 +
                                                                           (long)(int)pfVar15[-2] *
                                                                           4 + lVar20)),0x20);
                          auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)((long)pvVar8 +
                                                                           (long)(int)pfVar15[-1] *
                                                                           4 + lVar20)),0x30);
                          auVar41._0_4_ = auVar31._0_4_ * *pfVar15;
                          auVar41._4_4_ = auVar31._4_4_ * pfVar15[1];
                          auVar41._8_4_ = auVar31._8_4_ * pfVar15[2];
                          auVar41._12_4_ = auVar31._12_4_ * pfVar15[3];
                          auVar31 = vhaddps_avx(auVar41,auVar41);
                          auVar31 = vhaddps_avx(auVar31,auVar31);
                          auVar39 = ZEXT464((uint)(auVar39._0_4_ + auVar31._0_4_));
                          pfVar15 = pfVar15 + 8;
                          iVar18 = iVar18 + -1;
                        } while (iVar18 != 0);
                      }
                      auVar38 = auVar39._0_16_;
                      iVar23 = iVar23 + 1;
                      iVar17 = iVar17 + iVar19;
                    } while (iVar23 != iVar12);
                    iVar16 = iVar16 + iVar19 * iVar12;
                    this = local_90;
                  }
                  fVar40 = 0.0;
                  if (fVar36 > fVar35 && fVar44 > fVar43) {
                    fVar40 = auVar38._0_4_ / (float)(iVar12 * iVar21);
                  }
                  *(float *)((long)local_110 + lVar14 * 4) = fVar40;
                  p_Var10 = local_d0[-3];
                  iVar12 = *(int *)(&this->field_0xd0 + (long)p_Var10);
                  lVar14 = lVar1;
                  local_d8 = uVar13;
                } while (lVar1 < iVar12);
              }
              local_110 = (void *)((long)local_110 + (long)iVar12 * 4);
              uVar13 = (ulong)(iVar11 + 1U);
            } while ((int)(iVar11 + 1U) < *(int *)(&this->field_0xd4 + (long)local_d0[-3]));
          }
          local_f8 = (void *)((long)local_f8 + 1);
        } while (local_f8 != local_e8);
      }
    }
    if (pre_calc.super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pre_calc.
                      super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int ROIAlign_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}